

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::ubjson::basic_ubjson_parser<jsoncons::bytes_source,_std::allocator<char>_>::reset
          (basic_ubjson_parser<jsoncons::bytes_source,_std::allocator<char>_> *this)

{
  pointer ppVar1;
  uchar local_19;
  int local_18 [2];
  
  this->more_ = true;
  this->done_ = false;
  (this->text_buffer_)._M_string_length = 0;
  *(this->text_buffer_)._M_dataplus._M_p = '\0';
  ppVar1 = (this->state_stack_).
           super__Vector_base<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->state_stack_).
      super__Vector_base<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar1) {
    (this->state_stack_).
    super__Vector_base<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar1;
  }
  local_18[1] = 0;
  local_18[0] = 0;
  local_19 = '\0';
  std::vector<jsoncons::ubjson::parse_state,std::allocator<jsoncons::ubjson::parse_state>>::
  emplace_back<jsoncons::ubjson::parse_mode,int,unsigned_char>
            ((vector<jsoncons::ubjson::parse_state,std::allocator<jsoncons::ubjson::parse_state>> *)
             &this->state_stack_,(parse_mode *)(local_18 + 1),local_18,&local_19);
  this->nesting_depth_ = 0;
  return;
}

Assistant:

void reset()
    {
        more_ = true;
        done_ = false;
        text_buffer_.clear();
        state_stack_.clear();
        state_stack_.emplace_back(parse_mode::root,0,uint8_t(0));
        nesting_depth_ = 0;
    }